

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::EmitLoadConstInt(SQCompiler *this,SQInteger value,SQInteger target)

{
  SQInteger in_RDX;
  long in_RSI;
  SQInteger in_RDI;
  SQFuncState *unaff_retaddr;
  SQInteger in_stack_ffffffffffffffd0;
  SQFuncState *in_stack_ffffffffffffffd8;
  SQInteger arg1;
  SQInteger cons;
  
  cons = in_RDI;
  if (in_RDX < 0) {
    in_RDX = SQFuncState::PushTarget(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  if ((in_RSI < 0x80000000) && (-0x80000000 < in_RSI)) {
    SQFuncState::AddInstruction
              (unaff_retaddr,(SQOpcode)((ulong)cons >> 0x20),in_RSI,in_RDX,in_RDI,
               (SQInteger)in_stack_ffffffffffffffd8);
  }
  else {
    arg1 = in_RDX;
    SQFuncState::GetNumericConstant(unaff_retaddr,cons);
    SQFuncState::AddInstruction
              (unaff_retaddr,(SQOpcode)((ulong)cons >> 0x20),in_RSI,arg1,in_RDI,in_RDX);
  }
  return;
}

Assistant:

void EmitLoadConstInt(SQInteger value,SQInteger target)
    {
        if(target < 0) {
            target = _fs->PushTarget();
        }
        if(value <= INT_MAX && value > INT_MIN) { //does it fit in 32 bits?
            _fs->AddInstruction(_OP_LOADINT, target,value);
        }
        else {
            _fs->AddInstruction(_OP_LOAD, target, _fs->GetNumericConstant(value));
        }
    }